

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall
kj::Promise<kj::Own<capnp::ClientHook>_>::fork(Promise<kj::Own<capnp::ClientHook>_> *this)

{
  Own<kj::_::PromiseNode> *in_RSI;
  Own<kj::_::ForkHub<kj::Own<capnp::ClientHook>_>_> local_28;
  
  refcounted<kj::_::ForkHub<kj::Own<capnp::ClientHook>>,kj::Own<kj::_::PromiseNode>>
            ((kj *)&local_28,in_RSI);
  (this->super_PromiseBase).node.disposer = local_28.disposer;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)local_28.ptr;
  local_28.ptr = (ForkHub<kj::Own<capnp::ClientHook>_> *)0x0;
  Own<kj::_::ForkHub<kj::Own<capnp::ClientHook>_>_>::dispose(&local_28);
  return (__pid_t)this;
}

Assistant:

ForkedPromise<T> Promise<T>::fork() {
  return ForkedPromise<T>(false, refcounted<_::ForkHub<_::FixVoid<T>>>(kj::mv(node)));
}